

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedEnumValue
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          int value)

{
  CppType CVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  LogMessage *pLVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedEnum",CPPTYPE_ENUM);
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    this_00 = FieldDescriptor::enum_type(field);
    pEVar2 = EnumDescriptor::FindValueByNumber(this_00,value);
    if (pEVar2 == (EnumValueDescriptor *)0x0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x560);
      pLVar3 = LogMessage::operator<<
                         (&local_68,"SetRepeatedEnumValue accepts only valid integer values: ");
      pLVar3 = LogMessage::operator<<(pLVar3,"value ");
      pLVar3 = LogMessage::operator<<(pLVar3,value);
      pLVar3 = LogMessage::operator<<(pLVar3," unexpected for field ");
      pLVar3 = LogMessage::operator<<(pLVar3,*(string **)(field + 8));
      LogFinisher::operator=(&local_69,pLVar3);
      LogMessage::~LogMessage(&local_68);
      pEVar2 = FieldDescriptor::default_value_enum(field);
      value = *(int *)(pEVar2 + 0x10);
    }
  }
  SetRepeatedEnumValueInternal(this,message,field,index,value);
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedEnumValue(
    Message* message,
    const FieldDescriptor* field, int index,
    int value) const {
  USAGE_CHECK_ALL(SetRepeatedEnum, REPEATED, ENUM);
  if (!CreateUnknownEnumValues(descriptor_->file())) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == NULL) {
      GOOGLE_LOG(DFATAL) << "SetRepeatedEnumValue accepts only valid integer values: "
                  << "value " << value << " unexpected for field "
                  << field->full_name();
      // In production builds, DFATAL will not terminate the program, so we have
      // to do something reasonable: just set the default value.
      value = field->default_value_enum()->number();
    }
  }
  SetRepeatedEnumValueInternal(message, field, index, value);
}